

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deal.cpp
# Opt level: O0

void __thiscall Deal::bidding(Deal *this)

{
  Contract *pCVar1;
  int iVar2;
  ostream *poVar3;
  reference ppPVar4;
  undefined4 extraout_var;
  Contract *pCVar5;
  bool bVar6;
  int local_6c;
  Erase local_5c;
  Cursor local_54;
  Erase local_48;
  Cursor local_40;
  Cursor local_34;
  Erase local_28;
  Contract *local_20;
  Contract *tmp_c;
  int nbrOfPass;
  int speaker;
  Deal *this_local;
  
  if (this->_contractor == -1) {
    local_6c = this->_dealer;
  }
  else {
    local_6c = this->_contractor;
  }
  tmp_c._4_4_ = (local_6c + 1) % 4;
  tmp_c._0_4_ = 0;
  _nbrOfPass = this;
  AdvancedConsole::Erase::Erase(&local_28,AC_ALL,AC_SCREEN);
  AdvancedConsole::operator<<((ostream *)&std::cout,&local_28);
  AdvancedConsole::Cursor::Cursor(&local_34,0,0,AC_ABSOLUTE);
  poVar3 = AdvancedConsole::operator<<((ostream *)&std::cout,&local_34);
  std::operator<<(poVar3,"Proposes:");
  while( true ) {
    bVar6 = true;
    if ((2 < (int)tmp_c) && (bVar6 = false, (int)tmp_c == 3)) {
      bVar6 = this->_contract == (Contract *)0x0;
    }
    if (!bVar6) break;
    AdvancedConsole::Cursor::Cursor(&local_40,6,0,AC_ABSOLUTE);
    poVar3 = AdvancedConsole::operator<<((ostream *)&std::cout,&local_40);
    AdvancedConsole::Erase::Erase(&local_48,AC_ALL,AC_LINE);
    poVar3 = AdvancedConsole::operator<<(poVar3,&local_48);
    poVar3 = std::operator<<(poVar3,"Player: ");
    ppPVar4 = std::array<Player_*,_4UL>::operator[](&this->_players,(long)tmp_c._4_4_);
    poVar3 = ::operator<<(poVar3,*ppPVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    ppPVar4 = std::array<Player_*,_4UL>::operator[](&this->_players,(long)tmp_c._4_4_);
    iVar2 = (*((*ppPVar4)->super_Serializable)._vptr_Serializable[1])(*ppPVar4,this->_contract);
    local_20 = (Contract *)CONCAT44(extraout_var,iVar2);
    AdvancedConsole::Cursor::Cursor(&local_54,tmp_c._4_4_ + 2,0,AC_ABSOLUTE);
    poVar3 = AdvancedConsole::operator<<((ostream *)&std::cout,&local_54);
    AdvancedConsole::Erase::Erase(&local_5c,AC_ALL,AC_LINE);
    AdvancedConsole::operator<<(poVar3,&local_5c);
    pCVar1 = local_20;
    pCVar5 = Contract::Pass();
    if (pCVar1 == pCVar5) {
      ppPVar4 = std::array<Player_*,_4UL>::operator[](&this->_players,(long)tmp_c._4_4_);
      poVar3 = ::operator<<((ostream *)&std::cout,*ppPVar4);
      poVar3 = std::operator<<(poVar3," passed");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      tmp_c._0_4_ = (int)tmp_c + 1;
    }
    else if ((this->_contract == (Contract *)0x0) || (this->_contract < local_20)) {
      ppPVar4 = std::array<Player_*,_4UL>::operator[](&this->_players,(long)tmp_c._4_4_);
      poVar3 = ::operator<<((ostream *)&std::cout,*ppPVar4);
      poVar3 = std::operator<<(poVar3," proposed ");
      poVar3 = ::operator<<(poVar3,local_20);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      tmp_c._0_4_ = 0;
      this->_contract = local_20;
      this->_contractor = tmp_c._4_4_;
      makeMemento(this);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"Error, contract lower than the previous one");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      tmp_c._0_4_ = (int)tmp_c + 1;
    }
    tmp_c._4_4_ = (tmp_c._4_4_ + 1) % 4;
  }
  this->_state = Playing;
  makeMemento(this);
  return;
}

Assistant:

void Deal::bidding() {
    int speaker = ((_contractor == -1 ? _dealer : _contractor) + 1) % 4;
    int nbrOfPass = 0;
    Contract *tmp_c;
    cout << AdvancedConsole::Erase();
    cout << AdvancedConsole::Cursor(0, 0) << "Proposes:";
    while ((nbrOfPass < 3) || (nbrOfPass == 3 && _contract == nullptr)) {
        cout << AdvancedConsole::Cursor(6, 0)
             << AdvancedConsole::Erase(AdvancedConsole::AC_ALL, AdvancedConsole::AC_LINE)
             << "Player: " << *_players[speaker] << endl;
        tmp_c = _players[speaker]->proposeContract(_contract);


        cout << AdvancedConsole::Cursor(speaker + 2, 0)
             << AdvancedConsole::Erase(AdvancedConsole::AC_ALL, AdvancedConsole::AC_LINE);
        if (tmp_c == Contract::Pass()) {
            cout << *_players[speaker] << " passed" << endl;
            nbrOfPass++;
        } else if (_contract == nullptr || tmp_c > _contract) {
            cout << *_players[speaker] << " proposed " << *tmp_c << endl;
            nbrOfPass = 0;
            _contract = tmp_c;
            _contractor = speaker;
            makeMemento();
        } else {
            cout << "Error, contract lower than the previous one" << endl;
            nbrOfPass++;
        }
        speaker = (speaker + 1) % 4;
    }

    _state = State::Playing;
    makeMemento();
}